

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  byte bVar1;
  uint n;
  uint n_00;
  SPxOut *pSVar2;
  pointer pnVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  Status SVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *pCVar13;
  long lVar14;
  long *plVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  long *plVar17;
  undefined4 *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  soplex *psVar23;
  int iVar24;
  int i;
  ulong uVar25;
  byte bVar26;
  Real RVar27;
  SPxId polishId;
  DIdxSet slackcandidates;
  Verbosity old_verbosity;
  DIdxSet continuousvars;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  char local_c39;
  DataKey local_c38;
  int local_c2c;
  DIdxSet local_c28;
  ulong local_c08;
  int local_bfc;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_bf8;
  undefined8 uStack_bf0;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_be8;
  undefined8 uStack_be0;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_bd0;
  cpp_dec_float<200U,_int,_void> local_bc8;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_b48;
  undefined8 uStack_b40;
  DIdxSet local_b38;
  fpclass_type local_b18;
  int32_t iStack_b14;
  undefined8 uStack_b10;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_b00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_af8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a78;
  soplex local_9f8 [112];
  int local_988;
  byte local_984;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_980;
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [13];
  undefined3 uStack_90b;
  int iStack_908;
  bool bStack_904;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_900;
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [13];
  undefined3 uStack_88b;
  int iStack_888;
  bool bStack_884;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *local_880;
  cpp_dec_float<200U,_int,_void> local_878;
  cpp_dec_float<200U,_int,_void> local_7f8;
  cpp_dec_float<200U,_int,_void> local_778;
  cpp_dec_float<200U,_int,_void> local_6f8;
  cpp_dec_float<200U,_int,_void> local_678;
  cpp_dec_float<200U,_int,_void> local_5f0;
  cpp_dec_float<200U,_int,_void> local_570;
  cpp_dec_float<200U,_int,_void> local_4f0;
  cpp_dec_float<200U,_int,_void> local_470;
  cpp_dec_float<200U,_int,_void> local_3f0;
  uint local_370 [28];
  undefined4 local_300 [28];
  undefined4 local_290 [28];
  undefined4 local_220 [28];
  cpp_dec_float<200U,_int,_void> local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  undefined4 local_b0 [28];
  undefined4 local_40;
  undefined1 local_3c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  bVar26 = 0;
  if (((-1 < this->maxIters) &&
      (this->maxIters <=
       (this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).iterCount)) && (bVar5 = isTimeLimitReached(this,false), !bVar5)) {
    return false;
  }
  if ((this->polishObj == POLISH_OFF) || (SVar7 = status(this), SVar7 != OPTIMAL)) {
    bVar5 = false;
  }
  else {
    local_be8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 *)(this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.rowstat.data;
    local_bf8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 *)(this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.colstat.data;
    local_c38.info = 0;
    local_c38.idx = -1;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_130,this);
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
      local_af8.m_backend.data._M_elems[0] = 4;
      local_bc8.data._M_elems[0] = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity]," --- perform solution polishing",0x1f);
      cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_bc8);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_bc8,this);
      pcVar19 = &local_bc8;
      puVar21 = local_370;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar21 = (((cpp_dec_float<200U,_int,_void> *)&pcVar19->data)->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
        puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
      }
      local_bfc = local_bc8.exp;
      local_c39 = local_bc8.neg;
      local_b18 = local_bc8.fpclass;
      iStack_b14 = local_bc8.prec_elem;
      uStack_b10 = 0;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet(&local_c28,n);
        local_c08 = (ulong)n_00;
        DIdxSet::DIdxSet(&local_b38,n_00);
        if (0 < (int)n) {
          lVar10 = 0x78;
          uVar25 = 0;
          do {
            if ((*(uint *)((long)&local_be8->theitem + uVar25 * 4) | 2) == 0xfffffffe) {
              plVar17 = (long *)((long)(((this->theCoPvec->
                                         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data
                                       ._M_elems + lVar10);
              plVar15 = plVar17 + -0xf;
              puVar18 = local_220;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *puVar18 = (int)*plVar15;
                plVar15 = (long *)((long)plVar15 + (ulong)bVar26 * -8 + 4);
                puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
              }
              lVar11 = plVar17[-1];
              bVar1 = *(byte *)((long)plVar17 + -4);
              local_b48 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)*plVar17;
              uStack_b40 = 0;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_3f0,0,(type *)0x0);
              RVar27 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_678.fpclass = cpp_dec_float_finite;
              local_678.prec_elem = 0x1c;
              local_678.data._M_elems[0] = 0;
              local_678.data._M_elems[1] = 0;
              local_678.data._M_elems[2] = 0;
              local_678.data._M_elems[3] = 0;
              local_678.data._M_elems[4] = 0;
              local_678.data._M_elems[5] = 0;
              local_678.data._M_elems[6] = 0;
              local_678.data._M_elems[7] = 0;
              local_678.data._M_elems[8] = 0;
              local_678.data._M_elems[9] = 0;
              local_678.data._M_elems[10] = 0;
              local_678.data._M_elems[0xb] = 0;
              local_678.data._M_elems[0xc] = 0;
              local_678.data._M_elems[0xd] = 0;
              local_678.data._M_elems[0xe] = 0;
              local_678.data._M_elems[0xf] = 0;
              local_678.data._M_elems[0x10] = 0;
              local_678.data._M_elems[0x11] = 0;
              local_678.data._M_elems[0x12] = 0;
              local_678.data._M_elems[0x13] = 0;
              local_678.data._M_elems[0x14] = 0;
              local_678.data._M_elems[0x15] = 0;
              local_678.data._M_elems[0x16] = 0;
              local_678.data._M_elems[0x17] = 0;
              local_678.data._M_elems[0x18] = 0;
              local_678.data._M_elems[0x19] = 0;
              local_678.data._M_elems._104_5_ = 0;
              local_678.data._M_elems[0x1b]._1_3_ = 0;
              local_678.exp = 0;
              local_678.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_678,RVar27);
              puVar18 = local_220;
              psVar23 = local_9f8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                *(undefined4 *)psVar23 = *puVar18;
                puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
                psVar23 = psVar23 + (ulong)bVar26 * -8 + 4;
              }
              local_988 = (int)lVar11;
              local_984 = bVar1;
              local_980 = local_b48;
              pcVar19 = &local_3f0;
              pnVar20 = &local_a78;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_a78.m_backend.exp = local_3f0.exp;
              local_a78.m_backend.neg = local_3f0.neg;
              local_a78.m_backend.fpclass = local_3f0.fpclass;
              local_a78.m_backend.prec_elem = local_3f0.prec_elem;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_af8,local_9f8,&local_a78,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x0);
              pnVar20 = &local_af8;
              pcVar19 = &local_bc8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_bc8.exp = local_af8.m_backend.exp;
              local_bc8.neg = local_af8.m_backend.neg;
              local_bc8.fpclass = local_af8.m_backend.fpclass;
              local_bc8.prec_elem = local_af8.m_backend.prec_elem;
              if ((local_af8.m_backend.neg == true) &&
                 (local_bc8.data._M_elems[0] != ERROR ||
                  local_af8.m_backend.fpclass != cpp_dec_float_finite)) {
                local_bc8.neg = false;
              }
              if (((local_af8.m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_678.fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_678), iVar8 < 1)) {
                DIdxSet::addIdx(&local_c28,(int)uVar25);
              }
            }
            uVar25 = uVar25 + 1;
            lVar10 = lVar10 + 0x80;
          } while (n != uVar25);
        }
        if (0 < (int)local_c08 && (this->integerVariables).thesize == (int)local_c08) {
          lVar10 = 0x78;
          uVar25 = 0;
          do {
            if ((*(uint *)((long)&local_bf8->theitem + uVar25 * 4) | 2) == 0xfffffffe) {
              pnVar3 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pnVar3->m_backend).data._M_elems + lVar10 + -0x78);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar10 + -0x78);
              local_880 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0x1c00000000;
              local_8f8 = (undefined1  [16])0x0;
              local_8e8 = (undefined1  [16])0x0;
              local_8d8 = (undefined1  [16])0x0;
              local_8c8 = (undefined1  [16])0x0;
              local_8b8 = (undefined1  [16])0x0;
              local_8a8 = (undefined1  [16])0x0;
              local_898 = SUB1613((undefined1  [16])0x0,0);
              uStack_88b = 0;
              iStack_888 = 0;
              bStack_884 = false;
              if (pcVar19 == (cpp_dec_float<200U,_int,_void> *)local_8f8) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_8f8,pcVar16);
                if (local_8f8._0_4_ != 0 || (fpclass_type)local_880 != cpp_dec_float_finite) {
                  bStack_884 = (bool)(bStack_884 ^ 1);
                }
              }
              else {
                if (pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_8f8) {
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_8f8;
                  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                    (pcVar22->data)._M_elems[0] = (pcVar16->data)._M_elems[0];
                    pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar16 + (ulong)bVar26 * -8 + 4);
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar26 * -8 + 4);
                  }
                  iStack_888 = *(int *)((long)(pnVar3->m_backend).data._M_elems + lVar10 + -8);
                  bStack_884 = *(bool *)((long)(pnVar3->m_backend).data._M_elems + lVar10 + -4);
                  local_880 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(pnVar3->m_backend).data._M_elems + lVar10);
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_8f8,pcVar19);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_470,0,(type *)0x0);
              RVar27 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_6f8.fpclass = cpp_dec_float_finite;
              local_6f8.prec_elem = 0x1c;
              local_6f8.data._M_elems[0] = 0;
              local_6f8.data._M_elems[1] = 0;
              local_6f8.data._M_elems[2] = 0;
              local_6f8.data._M_elems[3] = 0;
              local_6f8.data._M_elems[4] = 0;
              local_6f8.data._M_elems[5] = 0;
              local_6f8.data._M_elems[6] = 0;
              local_6f8.data._M_elems[7] = 0;
              local_6f8.data._M_elems[8] = 0;
              local_6f8.data._M_elems[9] = 0;
              local_6f8.data._M_elems[10] = 0;
              local_6f8.data._M_elems[0xb] = 0;
              local_6f8.data._M_elems[0xc] = 0;
              local_6f8.data._M_elems[0xd] = 0;
              local_6f8.data._M_elems[0xe] = 0;
              local_6f8.data._M_elems[0xf] = 0;
              local_6f8.data._M_elems[0x10] = 0;
              local_6f8.data._M_elems[0x11] = 0;
              local_6f8.data._M_elems[0x12] = 0;
              local_6f8.data._M_elems[0x13] = 0;
              local_6f8.data._M_elems[0x14] = 0;
              local_6f8.data._M_elems[0x15] = 0;
              local_6f8.data._M_elems[0x16] = 0;
              local_6f8.data._M_elems[0x17] = 0;
              local_6f8.data._M_elems[0x18] = 0;
              local_6f8.data._M_elems[0x19] = 0;
              local_6f8.data._M_elems._104_5_ = 0;
              local_6f8.data._M_elems[0x1b]._1_3_ = 0;
              local_6f8.exp = 0;
              local_6f8.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_6f8,RVar27);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_8f8;
              psVar23 = local_9f8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *(uint *)psVar23 = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar26 * -8 + 4)
                ;
                psVar23 = psVar23 + (ulong)bVar26 * -8 + 4;
              }
              local_988 = iStack_888;
              local_984 = bStack_884;
              local_980 = local_880;
              pcVar19 = &local_470;
              pnVar20 = &local_a78;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_a78.m_backend.exp = local_470.exp;
              local_a78.m_backend.neg = local_470.neg;
              local_a78.m_backend.fpclass = local_470.fpclass;
              local_a78.m_backend.prec_elem = local_470.prec_elem;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_af8,local_9f8,&local_a78,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x0);
              pnVar20 = &local_af8;
              pcVar19 = &local_bc8;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_bc8.exp = local_af8.m_backend.exp;
              local_bc8.neg = local_af8.m_backend.neg;
              local_bc8.fpclass = local_af8.m_backend.fpclass;
              local_bc8.prec_elem = local_af8.m_backend.prec_elem;
              if ((local_af8.m_backend.neg == true) &&
                 (local_bc8.data._M_elems[0] != ERROR ||
                  local_af8.m_backend.fpclass != cpp_dec_float_finite)) {
                local_bc8.neg = false;
              }
              if (((local_af8.m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_6f8.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     (&local_bc8,&local_6f8), iVar8 < 1 &&
                  ((this->integerVariables).data[uVar25] == 0)))) {
                DIdxSet::addIdx(&local_b38,(int)uVar25);
              }
            }
            uVar25 = uVar25 + 1;
            lVar10 = lVar10 + 0x80;
          } while (local_c08 != uVar25);
        }
        bVar5 = false;
        do {
          uVar25 = (ulong)local_c28.super_IdxSet.num;
          if (((long)uVar25 < 1) || (bVar5)) {
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            do {
              local_c38 = (DataKey)coId(this,local_c28.super_IdxSet.idx[uVar25 - 1]);
              bVar6 = enter(this,(SPxId *)&local_c38,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar10 = (long)local_c28.super_IdxSet.num;
                local_c28.super_IdxSet.num = local_c28.super_IdxSet.num + -1;
                local_c28.super_IdxSet.idx[uVar25 - 1] = local_c28.super_IdxSet.idx[lVar10 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < uVar25) && (uVar25 = uVar25 - 1, !bVar5));
          }
          uVar25 = (ulong)local_b38.super_IdxSet.num;
          if (0 < (long)uVar25) {
            while (!bVar5) {
              local_c38 = (DataKey)id(this,local_b38.super_IdxSet.idx[uVar25 - 1]);
              bVar6 = enter(this,(SPxId *)&local_c38,true);
              (*(this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar8 = iVar8 + 1;
                lVar10 = (long)local_b38.super_IdxSet.num;
                local_b38.super_IdxSet.num = local_b38.super_IdxSet.num + -1;
                local_b38.super_IdxSet.idx[uVar25 - 1] = local_b38.super_IdxSet.idx[lVar10 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <=
                    (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
              if (uVar25 < 2) break;
              uVar25 = uVar25 - 1;
            }
          }
          if (iVar8 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar8;
        } while (!bVar5);
        DIdxSet::~DIdxSet(&local_b38);
      }
      else {
        DIdxSet::DIdxSet(&local_c28,(this->thecovectors->set).thenum);
        if (0 < (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar10 = 0;
          lVar11 = 0;
          do {
            if ((*(uint *)((long)&local_bf8->theitem + lVar11 * 4) | 2) == 0xfffffffe) {
              pnVar3 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pnVar3->m_backend).data._M_elems + lVar10);
              pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(((this->thePvec->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                               _M_elems + lVar10);
              local_900 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                           *)0x1c00000000;
              local_978 = (undefined1  [16])0x0;
              local_968 = (undefined1  [16])0x0;
              local_958 = (undefined1  [16])0x0;
              local_948 = (undefined1  [16])0x0;
              local_938 = (undefined1  [16])0x0;
              local_928 = (undefined1  [16])0x0;
              local_918 = SUB1613((undefined1  [16])0x0,0);
              uStack_90b = 0;
              iStack_908 = 0;
              bStack_904 = false;
              if (pcVar16 == (cpp_dec_float<200U,_int,_void> *)local_978) {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_978,pcVar19);
                if (local_978._0_4_ != 0 || (fpclass_type)local_900 != cpp_dec_float_finite) {
                  bStack_904 = (bool)(bStack_904 ^ 1);
                }
              }
              else {
                if (pcVar19 != (cpp_dec_float<200U,_int,_void> *)local_978) {
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_978;
                  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
                    pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar19 + (ulong)bVar26 * -8 + 4);
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar26 * -8 + 4);
                  }
                  iStack_908 = *(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar10);
                  bStack_904 = *(bool *)((long)(&(pnVar3->m_backend).data + 1) + lVar10 + 4U);
                  local_900 = *(ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                                **)((long)(&(pnVar3->m_backend).data + 1) + lVar10 + 8U);
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_978,pcVar16);
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_4f0,0,(type *)0x0);
              RVar27 = Tolerances::epsilon((this->
                                           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           )._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              local_778.fpclass = cpp_dec_float_finite;
              local_778.prec_elem = 0x1c;
              local_778.data._M_elems[0] = 0;
              local_778.data._M_elems[1] = 0;
              local_778.data._M_elems[2] = 0;
              local_778.data._M_elems[3] = 0;
              local_778.data._M_elems[4] = 0;
              local_778.data._M_elems[5] = 0;
              local_778.data._M_elems[6] = 0;
              local_778.data._M_elems[7] = 0;
              local_778.data._M_elems[8] = 0;
              local_778.data._M_elems[9] = 0;
              local_778.data._M_elems[10] = 0;
              local_778.data._M_elems[0xb] = 0;
              local_778.data._M_elems[0xc] = 0;
              local_778.data._M_elems[0xd] = 0;
              local_778.data._M_elems[0xe] = 0;
              local_778.data._M_elems[0xf] = 0;
              local_778.data._M_elems[0x10] = 0;
              local_778.data._M_elems[0x11] = 0;
              local_778.data._M_elems[0x12] = 0;
              local_778.data._M_elems[0x13] = 0;
              local_778.data._M_elems[0x14] = 0;
              local_778.data._M_elems[0x15] = 0;
              local_778.data._M_elems[0x16] = 0;
              local_778.data._M_elems[0x17] = 0;
              local_778.data._M_elems[0x18] = 0;
              local_778.data._M_elems[0x19] = 0;
              local_778.data._M_elems._104_5_ = 0;
              local_778.data._M_elems[0x1b]._1_3_ = 0;
              local_778.exp = 0;
              local_778.neg = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)&local_778,RVar27);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_978;
              psVar23 = local_9f8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                *(uint *)psVar23 = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar26 * -8 + 4)
                ;
                psVar23 = psVar23 + (ulong)bVar26 * -8 + 4;
              }
              local_988 = iStack_908;
              local_984 = bStack_904;
              local_980 = local_900;
              pcVar19 = &local_4f0;
              pnVar20 = &local_a78;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_a78.m_backend.exp = local_4f0.exp;
              local_a78.m_backend.neg = local_4f0.neg;
              local_a78.m_backend.fpclass = local_4f0.fpclass;
              local_a78.m_backend.prec_elem = local_4f0.prec_elem;
              relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                        (&local_af8,local_9f8,&local_a78,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x0);
              pnVar20 = &local_af8;
              pcVar19 = &local_bc8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_bc8.exp = local_af8.m_backend.exp;
              local_bc8.neg = local_af8.m_backend.neg;
              local_bc8.fpclass = local_af8.m_backend.fpclass;
              local_bc8.prec_elem = local_af8.m_backend.prec_elem;
              if ((local_af8.m_backend.neg == true) &&
                 (local_bc8.data._M_elems[0] != ERROR ||
                  local_af8.m_backend.fpclass != cpp_dec_float_finite)) {
                local_bc8.neg = false;
              }
              if (((local_af8.m_backend.fpclass != cpp_dec_float_NaN) &&
                  (local_778.fpclass != cpp_dec_float_NaN)) &&
                 (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_778), iVar8 < 1)) {
                DIdxSet::addIdx(&local_c28,(int)lVar11);
              }
            }
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x80;
          } while (lVar11 < (this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        bVar5 = false;
        while ((uVar25 = (ulong)local_c28.super_IdxSet.num, 0 < (long)uVar25 && (!bVar5))) {
          iVar8 = 0;
          do {
            local_c38 = (DataKey)id(this,local_c28.super_IdxSet.idx[uVar25 - 1]);
            bVar6 = enter(this,(SPxId *)&local_c38,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar8 = iVar8 + 1;
              lVar10 = (long)local_c28.super_IdxSet.num;
              local_c28.super_IdxSet.num = local_c28.super_IdxSet.num + -1;
              local_c28.super_IdxSet.idx[uVar25 - 1] = local_c28.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
          } while ((1 < uVar25) && (uVar25 = uVar25 - 1, !bVar5));
          if ((iVar8 == 0) || (this->polishCount = this->polishCount + iVar8, bVar5)) break;
        }
      }
    }
    else {
      local_b48 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                   *)&(this->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_bc8,this);
      pcVar19 = &local_bc8;
      puVar21 = local_370;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar21 = (((cpp_dec_float<200U,_int,_void> *)&pcVar19->data)->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
        puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
      }
      local_bfc = local_bc8.exp;
      local_c39 = local_bc8.neg;
      local_b18 = local_bc8.fpclass;
      iStack_b14 = local_bc8.prec_elem;
      uStack_b10 = 0;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar8 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      iVar24 = (this->integerVariables).thesize;
      local_c08 = CONCAT44(local_c08._4_4_,iVar8);
      local_c2c = iVar24;
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_c28,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_b00 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                       *)&(this->
                          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thedesc.rowstat.data;
          local_bd0 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          local_bf8 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar11 = 0xf;
          lVar10 = 0;
          do {
            local_c38 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar10].super_DataKey;
            if (local_c38.info < 0) {
              iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                      ::number(local_bf8,&local_c38);
              pCVar13 = local_b00;
LAB_00510293:
              if ((*(uint *)((long)&(pCVar13->theitem->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + (long)iVar9 * 4) & 0xfffffffd) == 0xfffffffc) {
                plVar15 = (long *)((((this->theFvec->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + lVar11 * 2);
                plVar17 = plVar15 + -0xf;
                puVar18 = local_290;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *puVar18 = (int)*plVar17;
                  plVar17 = (long *)((long)plVar17 + (ulong)bVar26 * -8 + 4);
                  puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
                }
                lVar12 = plVar15[-1];
                bVar1 = *(byte *)((long)plVar15 + -4);
                local_be8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                             *)*plVar15;
                uStack_be0 = 0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_570,0,(type *)0x0);
                RVar27 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_7f8.fpclass = cpp_dec_float_finite;
                local_7f8.prec_elem = 0x1c;
                local_7f8.data._M_elems[0] = 0;
                local_7f8.data._M_elems[1] = 0;
                local_7f8.data._M_elems[2] = 0;
                local_7f8.data._M_elems[3] = 0;
                local_7f8.data._M_elems[4] = 0;
                local_7f8.data._M_elems[5] = 0;
                local_7f8.data._M_elems[6] = 0;
                local_7f8.data._M_elems[7] = 0;
                local_7f8.data._M_elems[8] = 0;
                local_7f8.data._M_elems[9] = 0;
                local_7f8.data._M_elems[10] = 0;
                local_7f8.data._M_elems[0xb] = 0;
                local_7f8.data._M_elems[0xc] = 0;
                local_7f8.data._M_elems[0xd] = 0;
                local_7f8.data._M_elems[0xe] = 0;
                local_7f8.data._M_elems[0xf] = 0;
                local_7f8.data._M_elems[0x10] = 0;
                local_7f8.data._M_elems[0x11] = 0;
                local_7f8.data._M_elems[0x12] = 0;
                local_7f8.data._M_elems[0x13] = 0;
                local_7f8.data._M_elems[0x14] = 0;
                local_7f8.data._M_elems[0x15] = 0;
                local_7f8.data._M_elems[0x16] = 0;
                local_7f8.data._M_elems[0x17] = 0;
                local_7f8.data._M_elems[0x18] = 0;
                local_7f8.data._M_elems[0x19] = 0;
                local_7f8.data._M_elems._104_5_ = 0;
                local_7f8.data._M_elems[0x1b]._1_3_ = 0;
                local_7f8.exp = 0;
                local_7f8.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&local_7f8,RVar27);
                puVar18 = local_290;
                psVar23 = local_9f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *(undefined4 *)psVar23 = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
                  psVar23 = psVar23 + (ulong)bVar26 * -8 + 4;
                }
                local_988 = (int)lVar12;
                local_984 = bVar1;
                local_980 = local_be8;
                pcVar19 = &local_570;
                pnVar20 = &local_a78;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                }
                local_a78.m_backend.exp = local_570.exp;
                local_a78.m_backend.neg = local_570.neg;
                local_a78.m_backend.fpclass = local_570.fpclass;
                local_a78.m_backend.prec_elem = local_570.prec_elem;
                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_af8,local_9f8,&local_a78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x0);
                pnVar20 = &local_af8;
                pcVar19 = &local_bc8;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar26 * -8 + 4);
                }
                local_bc8.exp = local_af8.m_backend.exp;
                local_bc8.neg = local_af8.m_backend.neg;
                local_bc8.fpclass = local_af8.m_backend.fpclass;
                local_bc8.prec_elem = local_af8.m_backend.prec_elem;
                if ((local_af8.m_backend.neg == true) &&
                   (local_bc8.data._M_elems[0] != ERROR ||
                    local_af8.m_backend.fpclass != cpp_dec_float_finite)) {
                  local_bc8.neg = false;
                }
                if ((local_af8.m_backend.fpclass == cpp_dec_float_NaN) ||
                   (local_7f8.fpclass == cpp_dec_float_NaN)) {
                  iVar8 = (int)local_c08;
                  iVar24 = local_c2c;
                }
                else {
                  iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_7f8);
                  iVar24 = local_c2c;
                  iVar8 = (int)local_c08;
                  if (iVar9 < 1) {
                    DIdxSet::addIdx(&local_c28,(int)lVar10);
                  }
                }
              }
            }
            else if (iVar24 == iVar8) {
              SPxColId::SPxColId((SPxColId *)&local_bc8,(SPxId *)&local_c38);
              iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                      ::number(local_bd0,(DataKey *)&local_bc8);
              if ((this->integerVariables).data[iVar9] != 1) {
                pCVar13 = local_bf8;
                if (0 < local_c38.info) {
                  pCVar13 = local_bd0;
                }
                iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                        ::number(pCVar13,&local_c38);
                pCVar13 = local_b48;
                goto LAB_00510293;
              }
            }
            lVar10 = lVar10 + 1;
            lVar11 = lVar11 + 0x10;
          } while (lVar10 < (this->thecovectors->set).thenum);
        }
        bVar5 = false;
        while ((uVar25 = (ulong)local_c28.super_IdxSet.num, 0 < (long)uVar25 && (!bVar5))) {
          iVar8 = 0;
          do {
            bVar6 = leave(this,local_c28.super_IdxSet.idx[uVar25 - 1],true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar8 = iVar8 + 1;
              lVar10 = (long)local_c28.super_IdxSet.num;
              local_c28.super_IdxSet.num = local_c28.super_IdxSet.num + -1;
              local_c28.super_IdxSet.idx[uVar25 - 1] = local_c28.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
          } while ((1 < uVar25) && (uVar25 = uVar25 - 1, !bVar5));
          if ((iVar8 == 0) || (this->polishCount = this->polishCount + iVar8, bVar5)) break;
        }
      }
      else {
        DIdxSet::DIdxSet(&local_c28,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_be8 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set;
          lVar10 = 0x3c;
          lVar11 = 0;
          do {
            local_c38 = (this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).theBaseId.data[lVar11].super_DataKey;
            if (-1 < local_c38.info) {
              if (iVar24 == iVar8) {
                SPxColId::SPxColId((SPxColId *)&local_bc8,(SPxId *)&local_c38);
                iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                        ::number(local_be8,(DataKey *)&local_bc8);
                if ((this->integerVariables).data[iVar9] == 0) goto LAB_00510be1;
              }
              if ((*(uint *)((long)&(local_b48->theitem->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + lVar11 * 4) & 0xfffffffd) == 0xfffffffc) {
                plVar15 = (long *)((long)(((this->theFvec->
                                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                         data._M_elems + lVar10 * 2);
                plVar17 = plVar15 + -0xf;
                puVar18 = local_300;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *puVar18 = (int)*plVar17;
                  plVar17 = (long *)((long)plVar17 + (ulong)bVar26 * -8 + 4);
                  puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
                }
                lVar12 = plVar15[-1];
                bVar1 = *(byte *)((long)plVar15 + -4);
                local_bf8 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                             *)*plVar15;
                uStack_bf0 = 0;
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>(&local_5f0,0,(type *)0x0);
                RVar27 = Tolerances::epsilon((this->
                                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             )._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                local_878.fpclass = cpp_dec_float_finite;
                local_878.prec_elem = 0x1c;
                local_878.data._M_elems[0] = 0;
                local_878.data._M_elems[1] = 0;
                local_878.data._M_elems[2] = 0;
                local_878.data._M_elems[3] = 0;
                local_878.data._M_elems[4] = 0;
                local_878.data._M_elems[5] = 0;
                local_878.data._M_elems[6] = 0;
                local_878.data._M_elems[7] = 0;
                local_878.data._M_elems[8] = 0;
                local_878.data._M_elems[9] = 0;
                local_878.data._M_elems[10] = 0;
                local_878.data._M_elems[0xb] = 0;
                local_878.data._M_elems[0xc] = 0;
                local_878.data._M_elems[0xd] = 0;
                local_878.data._M_elems[0xe] = 0;
                local_878.data._M_elems[0xf] = 0;
                local_878.data._M_elems[0x10] = 0;
                local_878.data._M_elems[0x11] = 0;
                local_878.data._M_elems[0x12] = 0;
                local_878.data._M_elems[0x13] = 0;
                local_878.data._M_elems[0x14] = 0;
                local_878.data._M_elems[0x15] = 0;
                local_878.data._M_elems[0x16] = 0;
                local_878.data._M_elems[0x17] = 0;
                local_878.data._M_elems[0x18] = 0;
                local_878.data._M_elems[0x19] = 0;
                local_878.data._M_elems._104_5_ = 0;
                local_878.data._M_elems[0x1b]._1_3_ = 0;
                local_878.exp = 0;
                local_878.neg = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)&local_878,RVar27);
                puVar18 = local_300;
                psVar23 = local_9f8;
                for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                  *(undefined4 *)psVar23 = *puVar18;
                  puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
                  psVar23 = psVar23 + (ulong)bVar26 * -8 + 4;
                }
                local_988 = (int)lVar12;
                local_984 = bVar1;
                local_980 = local_bf8;
                pcVar19 = &local_5f0;
                pnVar20 = &local_a78;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                }
                local_a78.m_backend.exp = local_5f0.exp;
                local_a78.m_backend.neg = local_5f0.neg;
                local_a78.m_backend.fpclass = local_5f0.fpclass;
                local_a78.m_backend.prec_elem = local_5f0.prec_elem;
                relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                          (&local_af8,local_9f8,&local_a78,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x0);
                pnVar20 = &local_af8;
                pcVar19 = &local_bc8;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar26 * -8 + 4);
                }
                local_bc8.exp = local_af8.m_backend.exp;
                local_bc8.neg = local_af8.m_backend.neg;
                local_bc8.fpclass = local_af8.m_backend.fpclass;
                local_bc8.prec_elem = local_af8.m_backend.prec_elem;
                if ((local_af8.m_backend.neg == true) &&
                   (local_bc8.data._M_elems[0] != ERROR ||
                    local_af8.m_backend.fpclass != cpp_dec_float_finite)) {
                  local_bc8.neg = false;
                }
                if ((local_af8.m_backend.fpclass == cpp_dec_float_NaN) ||
                   (local_878.fpclass == cpp_dec_float_NaN)) {
                  iVar8 = (int)local_c08;
                  iVar24 = local_c2c;
                }
                else {
                  iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&local_bc8,&local_878);
                  iVar24 = local_c2c;
                  iVar8 = (int)local_c08;
                  if (iVar9 < 1) {
                    DIdxSet::addIdx(&local_c28,(int)lVar11);
                  }
                }
              }
            }
LAB_00510be1:
            lVar11 = lVar11 + 1;
            lVar10 = lVar10 + 0x40;
          } while (lVar11 < (this->thecovectors->set).thenum);
        }
        bVar5 = false;
        while ((uVar25 = (ulong)local_c28.super_IdxSet.num, 0 < (long)uVar25 && (!bVar5))) {
          iVar8 = 0;
          do {
            bVar6 = leave(this,local_c28.super_IdxSet.idx[uVar25 - 1],true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar8 = iVar8 + 1;
              lVar10 = (long)local_c28.super_IdxSet.num;
              local_c28.super_IdxSet.num = local_c28.super_IdxSet.num + -1;
              local_c28.super_IdxSet.idx[uVar25 - 1] = local_c28.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
          } while ((1 < uVar25) && (uVar25 = uVar25 - 1, !bVar5));
          if ((iVar8 == 0) || (this->polishCount = this->polishCount + iVar8, bVar5)) break;
        }
      }
    }
    DIdxSet::~DIdxSet(&local_c28);
    pSVar2 = this->spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (2 < (int)pSVar2->m_verbosity)) {
      local_af8.m_backend.data._M_elems[0] = 3;
      local_bc8.data._M_elems[0] = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar2->m_streams[pSVar2->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar2->m_streams[pSVar2->m_verbosity]," pivots)",8);
      cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_bc8);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(local_b0,this);
    puVar21 = local_130;
    pnVar20 = &local_a78;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = *puVar21;
      puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    puVar21 = local_370;
    pcVar19 = &local_1b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar19->data)._M_elems[0] = *puVar21;
      puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_1b0.exp = local_bfc;
    local_1b0.neg = (bool)local_c39;
    local_1b0.fpclass = local_b18;
    local_1b0.prec_elem = iStack_b14;
    puVar18 = local_b0;
    psVar23 = local_9f8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined4 *)psVar23 = *puVar18;
      puVar18 = puVar18 + (ulong)bVar26 * -2 + 1;
      psVar23 = psVar23 + (ulong)bVar26 * -8 + 4;
    }
    local_988 = local_40;
    local_984 = local_3c;
    local_980 = (ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                 *)local_38;
    local_a78.m_backend.exp = local_c0;
    local_a78.m_backend.neg = (bool)local_bc;
    local_a78.m_backend.fpclass = local_b8;
    local_a78.m_backend.prec_elem = iStack_b4;
    relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_af8,local_9f8,&local_a78,local_38);
    pnVar20 = &local_af8;
    pcVar19 = &local_bc8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar26 * -2 + 1) * 4);
      pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_bc8.exp = local_af8.m_backend.exp;
    local_bc8.neg = local_af8.m_backend.neg;
    local_bc8.fpclass = local_af8.m_backend.fpclass;
    local_bc8.prec_elem = local_af8.m_backend.prec_elem;
    if ((local_af8.m_backend.neg == true) &&
       (local_bc8.data._M_elems[0] != ERROR || local_af8.m_backend.fpclass != cpp_dec_float_finite))
    {
      local_bc8.neg = false;
    }
    bVar5 = true;
    if ((local_af8.m_backend.fpclass != cpp_dec_float_NaN) && (local_b18 != cpp_dec_float_NaN)) {
      iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_bc8,&local_1b0);
      bVar5 = 0 < iVar8;
    }
  }
  return bVar5;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}